

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::CleanupParseStack
          (Parse<SGParser::Generator::StdGrammarStackElement> *this,size_t tillPos)

{
  ulong local_20;
  size_t i;
  size_t tillPos_local;
  Parse<SGParser::Generator::StdGrammarStackElement> *this_local;
  
  for (local_20 = this->StackPosition; tillPos < local_20; local_20 = local_20 - 1) {
    if (this->pStack[local_20].super_ParseStackElement<SGParser::Generator::StdGrammarToken>.
        TerminalMarker != 0xffffffffffffffff) {
      BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::ReleaseMarker
                (&this->Stream,
                 this->pStack[local_20].
                 super_ParseStackElement<SGParser::Generator::StdGrammarToken>.TerminalMarker);
    }
    Generator::StdGrammarStackElement::Cleanup(this->pStack + local_20);
  }
  this->StackPosition = tillPos;
  return;
}

Assistant:

void Parse<StackElement>::CleanupParseStack(size_t tillPos) {
    // Call the destroy function for all stack elements (except 0 - special element)
    for (auto i = StackPosition; i > tillPos; --i) {
        if (pStack[i].TerminalMarker != InvalidIndex)
            Stream.ReleaseMarker(pStack[i].TerminalMarker);
        pStack[i].Cleanup();
    }
    // And reset position to last 'valid' element - usually 0
    StackPosition = tillPos;
}